

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void assume_value_suite::get_array(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_178;
  iterator local_168;
  iterator local_150;
  basic_variable<std::allocator<char>_> *local_138;
  basic_variable<std::allocator<char>_> *local_130;
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  *local_128;
  vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  *result;
  basic_variable<std::allocator<char>_> *local_110;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_110 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_110,true);
  local_110 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_110,2);
  local_110 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_110,3.0);
  local_110 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_110,"alpha");
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x4;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_178 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_178 = local_178 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_178);
  } while (local_178 != &local_108);
  local_128 = trial::dynamic::basic_variable<std::allocator<char>>::
              assume_value<std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>
                        ((basic_variable<std::allocator<char>> *)local_38);
  local_130 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::begin(local_128);
  local_138 = (basic_variable<std::allocator<char>_> *)
              std::
              vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
              ::end(local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_150,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_168,(basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<trial::dynamic::basic_variable<std::allocator<char>>*,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>>,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x1422,"void assume_value_suite::get_array()",local_130,local_138,&local_150,
             &local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_168);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void get_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha" });
    auto& result = data.assume_value<variable::array_type>();
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 data.begin(), data.end(),
                                 std::equal_to<variable>());
}